

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O0

void printAVXCC(MCInst *MI,uint Op,SStream *O)

{
  byte bVar1;
  MCOperand *op;
  int64_t iVar3;
  char *s;
  uint in_ESI;
  MCInst *in_RDI;
  uint8_t Imm;
  undefined7 in_stack_ffffffffffffffe0;
  byte bVar2;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  iVar3 = MCOperand_getImm(op);
  bVar2 = (byte)iVar3;
  bVar1 = bVar2 & 0x1f;
  s = (char *)(ulong)bVar1;
  switch(s) {
  case (char *)0x0:
    SStream_concat0((SStream *)(CONCAT17(bVar2,in_stack_ffffffffffffffe0) & 0x1fffffffffffffff),s);
    op_addAvxCC(in_RDI,1);
    break;
  case (char *)0x1:
    SStream_concat0((SStream *)(CONCAT17(bVar2,in_stack_ffffffffffffffe0) & 0x1fffffffffffffff),s);
    op_addAvxCC(in_RDI,2);
    break;
  case (char *)0x2:
    SStream_concat0((SStream *)(CONCAT17(bVar2,in_stack_ffffffffffffffe0) & 0x1fffffffffffffff),s);
    op_addAvxCC(in_RDI,3);
    break;
  case (char *)0x3:
    SStream_concat0((SStream *)(CONCAT17(bVar2,in_stack_ffffffffffffffe0) & 0x1fffffffffffffff),s);
    op_addAvxCC(in_RDI,4);
    break;
  case (char *)0x4:
    SStream_concat0((SStream *)(CONCAT17(bVar2,in_stack_ffffffffffffffe0) & 0x1fffffffffffffff),s);
    op_addAvxCC(in_RDI,5);
    break;
  case (char *)0x5:
    SStream_concat0((SStream *)(CONCAT17(bVar2,in_stack_ffffffffffffffe0) & 0x1fffffffffffffff),s);
    op_addAvxCC(in_RDI,6);
    break;
  case (char *)0x6:
    SStream_concat0((SStream *)(CONCAT17(bVar2,in_stack_ffffffffffffffe0) & 0x1fffffffffffffff),s);
    op_addAvxCC(in_RDI,7);
    break;
  case (char *)0x7:
    SStream_concat0((SStream *)(CONCAT17(bVar2,in_stack_ffffffffffffffe0) & 0x1fffffffffffffff),s);
    op_addAvxCC(in_RDI,8);
    break;
  case (char *)0x8:
    SStream_concat0((SStream *)(CONCAT17(bVar2,in_stack_ffffffffffffffe0) & 0x1fffffffffffffff),s);
    op_addAvxCC(in_RDI,9);
    break;
  case (char *)0x9:
    SStream_concat0((SStream *)(CONCAT17(bVar2,in_stack_ffffffffffffffe0) & 0x1fffffffffffffff),s);
    op_addAvxCC(in_RDI,10);
    break;
  case (char *)0xa:
    SStream_concat0((SStream *)(CONCAT17(bVar2,in_stack_ffffffffffffffe0) & 0x1fffffffffffffff),s);
    op_addAvxCC(in_RDI,0xb);
    break;
  case (char *)0xb:
    SStream_concat0((SStream *)(CONCAT17(bVar2,in_stack_ffffffffffffffe0) & 0x1fffffffffffffff),s);
    op_addAvxCC(in_RDI,0xc);
    break;
  case (char *)0xc:
    SStream_concat0((SStream *)(CONCAT17(bVar2,in_stack_ffffffffffffffe0) & 0x1fffffffffffffff),s);
    op_addAvxCC(in_RDI,0xd);
    break;
  case (char *)0xd:
    SStream_concat0((SStream *)(CONCAT17(bVar2,in_stack_ffffffffffffffe0) & 0x1fffffffffffffff),s);
    op_addAvxCC(in_RDI,0xe);
    break;
  case (char *)0xe:
    SStream_concat0((SStream *)(CONCAT17(bVar2,in_stack_ffffffffffffffe0) & 0x1fffffffffffffff),s);
    op_addAvxCC(in_RDI,0xf);
    break;
  case (char *)0xf:
    SStream_concat0((SStream *)(CONCAT17(bVar2,in_stack_ffffffffffffffe0) & 0x1fffffffffffffff),s);
    op_addAvxCC(in_RDI,0x10);
    break;
  case (char *)0x10:
    SStream_concat0((SStream *)(CONCAT17(bVar2,in_stack_ffffffffffffffe0) & 0x1fffffffffffffff),s);
    op_addAvxCC(in_RDI,0x11);
    break;
  case (char *)0x11:
    SStream_concat0((SStream *)(CONCAT17(bVar2,in_stack_ffffffffffffffe0) & 0x1fffffffffffffff),s);
    op_addAvxCC(in_RDI,0x12);
    break;
  case (char *)0x12:
    SStream_concat0((SStream *)(CONCAT17(bVar2,in_stack_ffffffffffffffe0) & 0x1fffffffffffffff),s);
    op_addAvxCC(in_RDI,0x13);
    break;
  case (char *)0x13:
    SStream_concat0((SStream *)(CONCAT17(bVar2,in_stack_ffffffffffffffe0) & 0x1fffffffffffffff),s);
    op_addAvxCC(in_RDI,0x14);
    break;
  case (char *)0x14:
    SStream_concat0((SStream *)(CONCAT17(bVar2,in_stack_ffffffffffffffe0) & 0x1fffffffffffffff),s);
    op_addAvxCC(in_RDI,0x15);
    break;
  case (char *)0x15:
    SStream_concat0((SStream *)(CONCAT17(bVar2,in_stack_ffffffffffffffe0) & 0x1fffffffffffffff),s);
    op_addAvxCC(in_RDI,0x16);
    break;
  case (char *)0x16:
    SStream_concat0((SStream *)(CONCAT17(bVar2,in_stack_ffffffffffffffe0) & 0x1fffffffffffffff),s);
    op_addAvxCC(in_RDI,0x17);
    break;
  case (char *)0x17:
    SStream_concat0((SStream *)(CONCAT17(bVar2,in_stack_ffffffffffffffe0) & 0x1fffffffffffffff),s);
    op_addAvxCC(in_RDI,0x18);
    break;
  case (char *)0x18:
    SStream_concat0((SStream *)(CONCAT17(bVar2,in_stack_ffffffffffffffe0) & 0x1fffffffffffffff),s);
    op_addAvxCC(in_RDI,0x19);
    break;
  case (char *)0x19:
    SStream_concat0((SStream *)(CONCAT17(bVar2,in_stack_ffffffffffffffe0) & 0x1fffffffffffffff),s);
    op_addAvxCC(in_RDI,0x1a);
    break;
  case (char *)0x1a:
    SStream_concat0((SStream *)(CONCAT17(bVar2,in_stack_ffffffffffffffe0) & 0x1fffffffffffffff),s);
    op_addAvxCC(in_RDI,0x1b);
    break;
  case (char *)0x1b:
    SStream_concat0((SStream *)(CONCAT17(bVar2,in_stack_ffffffffffffffe0) & 0x1fffffffffffffff),s);
    op_addAvxCC(in_RDI,0x1c);
    break;
  case (char *)0x1c:
    SStream_concat0((SStream *)(CONCAT17(bVar2,in_stack_ffffffffffffffe0) & 0x1fffffffffffffff),s);
    op_addAvxCC(in_RDI,0x1d);
    break;
  case (char *)0x1d:
    SStream_concat0((SStream *)(CONCAT17(bVar2,in_stack_ffffffffffffffe0) & 0x1fffffffffffffff),s);
    op_addAvxCC(in_RDI,0x1e);
    break;
  case (char *)0x1e:
    SStream_concat0((SStream *)(CONCAT17(bVar2,in_stack_ffffffffffffffe0) & 0x1fffffffffffffff),s);
    op_addAvxCC(in_RDI,0x1f);
    break;
  case (char *)0x1f:
    SStream_concat0((SStream *)(CONCAT17(bVar2,in_stack_ffffffffffffffe0) & 0x1fffffffffffffff),s);
    op_addAvxCC(in_RDI,0x20);
  }
  in_RDI->popcode_adjust = bVar1 + 1;
  return;
}

Assistant:

static void printAVXCC(MCInst *MI, unsigned Op, SStream *O)
{
	uint8_t Imm = (uint8_t)(MCOperand_getImm(MCInst_getOperand(MI, Op)) & 0x1f);
	switch (Imm) {
		default: break;//printf("Invalid avxcc argument!\n"); break;
		case    0: SStream_concat0(O, "eq"); op_addAvxCC(MI, X86_AVX_CC_EQ); break;
		case    1: SStream_concat0(O, "lt"); op_addAvxCC(MI, X86_AVX_CC_LT); break;
		case    2: SStream_concat0(O, "le"); op_addAvxCC(MI, X86_AVX_CC_LE); break;
		case    3: SStream_concat0(O, "unord"); op_addAvxCC(MI, X86_AVX_CC_UNORD); break;
		case    4: SStream_concat0(O, "neq"); op_addAvxCC(MI, X86_AVX_CC_NEQ); break;
		case    5: SStream_concat0(O, "nlt"); op_addAvxCC(MI, X86_AVX_CC_NLT); break;
		case    6: SStream_concat0(O, "nle"); op_addAvxCC(MI, X86_AVX_CC_NLE); break;
		case    7: SStream_concat0(O, "ord"); op_addAvxCC(MI, X86_AVX_CC_ORD); break;
		case    8: SStream_concat0(O, "eq_uq"); op_addAvxCC(MI, X86_AVX_CC_EQ_UQ); break;
		case    9: SStream_concat0(O, "nge"); op_addAvxCC(MI, X86_AVX_CC_NGE); break;
		case  0xa: SStream_concat0(O, "ngt"); op_addAvxCC(MI, X86_AVX_CC_NGT); break;
		case  0xb: SStream_concat0(O, "false"); op_addAvxCC(MI, X86_AVX_CC_FALSE); break;
		case  0xc: SStream_concat0(O, "neq_oq"); op_addAvxCC(MI, X86_AVX_CC_NEQ_OQ); break;
		case  0xd: SStream_concat0(O, "ge"); op_addAvxCC(MI, X86_AVX_CC_GE); break;
		case  0xe: SStream_concat0(O, "gt"); op_addAvxCC(MI, X86_AVX_CC_GT); break;
		case  0xf: SStream_concat0(O, "true"); op_addAvxCC(MI, X86_AVX_CC_TRUE); break;
		case 0x10: SStream_concat0(O, "eq_os"); op_addAvxCC(MI, X86_AVX_CC_EQ_OS); break;
		case 0x11: SStream_concat0(O, "lt_oq"); op_addAvxCC(MI, X86_AVX_CC_LT_OQ); break;
		case 0x12: SStream_concat0(O, "le_oq"); op_addAvxCC(MI, X86_AVX_CC_LE_OQ); break;
		case 0x13: SStream_concat0(O, "unord_s"); op_addAvxCC(MI, X86_AVX_CC_UNORD_S); break;
		case 0x14: SStream_concat0(O, "neq_us"); op_addAvxCC(MI, X86_AVX_CC_NEQ_US); break;
		case 0x15: SStream_concat0(O, "nlt_uq"); op_addAvxCC(MI, X86_AVX_CC_NLT_UQ); break;
		case 0x16: SStream_concat0(O, "nle_uq"); op_addAvxCC(MI, X86_AVX_CC_NLE_UQ); break;
		case 0x17: SStream_concat0(O, "ord_s"); op_addAvxCC(MI, X86_AVX_CC_ORD_S); break;
		case 0x18: SStream_concat0(O, "eq_us"); op_addAvxCC(MI, X86_AVX_CC_EQ_US); break;
		case 0x19: SStream_concat0(O, "nge_uq"); op_addAvxCC(MI, X86_AVX_CC_NGE_UQ); break;
		case 0x1a: SStream_concat0(O, "ngt_uq"); op_addAvxCC(MI, X86_AVX_CC_NGT_UQ); break;
		case 0x1b: SStream_concat0(O, "false_os"); op_addAvxCC(MI, X86_AVX_CC_FALSE_OS); break;
		case 0x1c: SStream_concat0(O, "neq_os"); op_addAvxCC(MI, X86_AVX_CC_NEQ_OS); break;
		case 0x1d: SStream_concat0(O, "ge_oq"); op_addAvxCC(MI, X86_AVX_CC_GE_OQ); break;
		case 0x1e: SStream_concat0(O, "gt_oq"); op_addAvxCC(MI, X86_AVX_CC_GT_OQ); break;
		case 0x1f: SStream_concat0(O, "true_us"); op_addAvxCC(MI, X86_AVX_CC_TRUE_US); break;
	}

	MI->popcode_adjust = Imm + 1;
}